

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

SRCINFO * __thiscall Js::ScriptContext::AddHostSrcInfo(ScriptContext *this,SRCINFO *pSrcInfo)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  SRCINFO *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (pSrcInfo == (SRCINFO *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x3cf,"(pSrcInfo != nullptr)","pSrcInfo != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&SRCINFO::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2cb70d5;
  data.filename._0_4_ = 0x3d1;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (SRCINFO *)new<Memory::Recycler>(0x28,alloc,0x51e21e);
  SRCINFO::SRCINFO(this_00,pSrcInfo);
  return this_00;
}

Assistant:

SRCINFO *ScriptContext::AddHostSrcInfo(SRCINFO const *pSrcInfo)
    {
        Assert(pSrcInfo != nullptr);

        return RecyclerNewZ(this->GetRecycler(), SRCINFO, *pSrcInfo);
    }